

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::PotVecAccumulator::getStdDev(PotVecAccumulator *this,ResultType *ret)

{
  uint i;
  long lVar1;
  double dVar2;
  ResultType var;
  Vector<double,_7U> local_50;
  
  Vector<double,_7U>::Vector(&local_50);
  getVariance(this,&local_50);
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    dVar2 = local_50.data_[lVar1];
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    ret->data_[lVar1] = dVar2;
  }
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = sqrt(var[i]);
      }
      return;
    }